

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<const_char_(&)[2],_ProString> *b)

{
  ArrayOptions *pAVar1;
  char16_t *pcVar2;
  QChar *__dest;
  long lVar3;
  CutResult CVar4;
  Data *pDVar5;
  long lVar6;
  char16_t *__src;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QChar *it;
  QChar *local_48;
  long local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (a->d).d;
  lVar8 = (a->d).size;
  lVar9 = lVar8 + (b->b).m_length + 1;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar8);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) goto LAB_00248fb5;
    if (0 < lVar9) {
      lVar8 = (a->d).size;
      goto LAB_0024900a;
    }
  }
  else {
LAB_00248fb5:
    lVar6 = (pDVar5->super_QArrayData).alloc;
    lVar8 = (a->d).size;
    lVar7 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((lVar6 - lVar8) - lVar7 < lVar9) {
      lVar3 = lVar6 * 2;
      if (lVar6 * 2 < lVar9) {
        lVar3 = lVar9;
      }
      lVar9 = lVar3;
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar6 - lVar7 <= lVar9)) {
LAB_0024900a:
        if (lVar9 < lVar8) {
          lVar9 = lVar8;
        }
        QString::reallocData((longlong)a,(AllocationOption)lVar9);
        pDVar5 = (a->d).d;
        if (pDVar5 == (Data *)0x0) goto LAB_0024903a;
        lVar6 = (pDVar5->super_QArrayData).alloc;
      }
      if (lVar6 != 0) {
        pAVar1 = &(pDVar5->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0024904b;
  }
LAB_0024903a:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_0024904b:
  local_48 = (QChar *)((a->d).ptr + (a->d).size);
  QVar10.m_data = *b->a;
  QVar10.m_size = 1;
  QAbstractConcatenable::convertFromUtf8(QVar10,&local_48);
  __dest = local_48;
  lVar8 = (long)(b->b).m_length;
  if (lVar8 != 0) {
    pcVar2 = (b->b).m_string.d.ptr;
    local_38 = (long)(b->b).m_offset;
    local_40 = lVar8;
    CVar4 = QtPrivate::QContainerImplHelper::mid((b->b).m_string.d.size,&local_38,&local_40);
    __src = (char16_t *)0x0;
    if (CVar4 != Null) {
      __src = pcVar2 + local_38;
    }
    memcpy(__dest,__src,lVar8 * 2);
    local_48 = local_48 + lVar8;
  }
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}